

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O2

KinematicsModel * __thiscall
COLLADASaxFWL::DocumentProcessor::getKinematicsModelByUri(DocumentProcessor *this,URI *uri)

{
  KinematicsIntermediateData *pKVar1;
  KinematicsModel *pKVar2;
  const_iterator cVar3;
  
  pKVar1 = this->mKinematicsIntermediateData;
  cVar3 = std::tr1::
          _Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ::find((_Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  *)&pKVar1->mKinematicsModels,uri);
  if (cVar3.
      super__Hashtable_iterator_base<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false>
      ._M_cur_node ==
      (pKVar1->mKinematicsModels).
      super_unordered_map<COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*,_std::tr1::hash<COLLADABU::URI>,_std::equal_to<COLLADABU::URI>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>_>
      .
      super___unordered_map<COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*,_std::tr1::hash<COLLADABU::URI>,_std::equal_to<COLLADABU::URI>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_false>
      .
      super__Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_buckets
      [(pKVar1->mKinematicsModels).
       super_unordered_map<COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*,_std::tr1::hash<COLLADABU::URI>,_std::equal_to<COLLADABU::URI>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>_>
       .
       super___unordered_map<COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*,_std::tr1::hash<COLLADABU::URI>,_std::equal_to<COLLADABU::URI>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_false>
       .
       super__Hashtable<COLLADABU::URI,_std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_std::allocator<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::_Select1st<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>_>,_std::equal_to<COLLADABU::URI>,_std::tr1::hash<COLLADABU::URI>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
       ._M_bucket_count]) {
    pKVar2 = (KinematicsModel *)0x0;
  }
  else {
    pKVar2 = ((cVar3.
               super__Hashtable_iterator_base<std::pair<const_COLLADABU::URI,_COLLADASaxFWL::KinematicsModel_*>,_false>
              ._M_cur_node)->_M_v).second;
  }
  return pKVar2;
}

Assistant:

KinematicsModel* DocumentProcessor::getKinematicsModelByUri( const COLLADABU::URI& uri )
	{
		const KinematicsIntermediateData::KinematicsModelMap& map = mKinematicsIntermediateData.getKinematicsModels();
		KinematicsIntermediateData::KinematicsModelMap::const_iterator it = map.find(uri);
		if ( it != map.end() )
		{
			return it->second;
		}
		else
		{
			return 0;
		}
	}